

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  ImVec2 p_last;
  ImVec2 p_current;
  undefined1 extraout_var [56];
  
  p_last = *p1;
  auVar6 = ZEXT464(0x7f7fffff);
  iVar2 = 1;
  auVar4 = ZEXT864(0);
  while (iVar2 - (~(num_segments >> 0x1f) & num_segments) != 1) {
    auVar3 = auVar4._0_16_;
    auVar5._0_8_ = ImBezierCalc(p1,p2,p3,p4,(float)iVar2 * (1.0 / (float)num_segments));
    auVar5._8_56_ = extraout_var;
    p_current = (ImVec2)vmovlps_avx(auVar5._0_16_);
    auVar4._0_8_ = ImLineClosestPoint(&p_last,&p_current,p);
    auVar4._8_56_ = extraout_var_00;
    auVar7 = vmovshdup_avx(auVar4._0_16_);
    fVar1 = p->y - auVar7._0_4_;
    auVar7 = ZEXT416((uint)(p->x - auVar4._0_4_));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar7,auVar7);
    if (auVar6._0_4_ <= auVar7._0_4_) {
      auVar4 = ZEXT1664(auVar3);
    }
    auVar7 = vminss_avx(auVar7,ZEXT416((uint)auVar6._0_4_));
    auVar6 = ZEXT1664(auVar7);
    iVar2 = iVar2 + 1;
    p_last = (ImVec2)vmovlps_avx(auVar5._0_16_);
  }
  return auVar4._0_8_;
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}